

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

Promise<void>
kj::anon_unknown_0::writeEach(AsyncOutputStream *out,ArrayPtr<const_kj::StringPtr> parts)

{
  StringPtr *pSVar1;
  size_t sVar2;
  StringPtr *pSVar3;
  char *pcVar4;
  StringPtr *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar5;
  Promise<void> PVar6;
  StringPtr *local_58;
  AsyncOutputStream *local_50;
  StringPtr *pSStack_48;
  Type local_40;
  StringPtr *local_28;
  AsyncOutputStream *out_local;
  ArrayPtr<const_kj::StringPtr> parts_local;
  
  out_local = (AsyncOutputStream *)parts.size_;
  local_28 = parts.ptr;
  parts_local.ptr = in_RCX;
  parts_local.size_ = (size_t)out;
  sVar2 = ArrayPtr<const_kj::StringPtr>::size((ArrayPtr<const_kj::StringPtr> *)&out_local);
  pSVar1 = local_28;
  if (sVar2 == 0) {
    Promise<void>::Promise((Promise<void> *)out);
    pPVar5 = extraout_RDX;
  }
  else {
    pSVar3 = ArrayPtr<const_kj::StringPtr>::operator[]
                       ((ArrayPtr<const_kj::StringPtr> *)&out_local,0);
    pcVar4 = StringPtr::begin(pSVar3);
    pSVar3 = ArrayPtr<const_kj::StringPtr>::operator[]
                       ((ArrayPtr<const_kj::StringPtr> *)&out_local,0);
    sVar2 = StringPtr::size(pSVar3);
    (**(code **)(pSVar1->content).ptr)(&local_40,pSVar1,pcVar4,sVar2);
    local_58 = local_28;
    local_50 = out_local;
    pSStack_48 = parts_local.ptr;
    Promise<void>::
    then<kj::(anonymous_namespace)::writeEach(kj::AsyncOutputStream&,kj::ArrayPtr<kj::StringPtr_const>)::__0,kj::_::PropagateException>
              ((Promise<void> *)out,&local_40,(PropagateException *)&local_58);
    Promise<void>::~Promise((Promise<void> *)&local_40);
    pPVar5 = extraout_RDX_00;
  }
  PVar6.super_PromiseBase.node.ptr = pPVar5;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)out;
  return (Promise<void>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> writeEach(kj::AsyncOutputStream& out, kj::ArrayPtr<const kj::StringPtr> parts) {
  if (parts.size() == 0) return kj::READY_NOW;

  return out.write(parts[0].begin(), parts[0].size())
      .then([&out,parts]() {
    return writeEach(out, parts.slice(1, parts.size()));
  });
}